

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O3

int32_t icu_63::DayPeriodRulesDataSink::parseSetNum(char *setNumStr,UErrorCode *errorCode)

{
  int iVar1;
  byte bVar2;
  byte *pbVar3;
  
  if (U_ZERO_ERROR < *errorCode) {
    return -1;
  }
  if ((((*setNumStr == 's') && (setNumStr[1] == 'e')) && (setNumStr[2] == 't')) &&
     (bVar2 = setNumStr[3], bVar2 != 0)) {
    pbVar3 = (byte *)(setNumStr + 4);
    iVar1 = 0;
    do {
      if (9 < (byte)(bVar2 - 0x30)) goto LAB_002cd3fa;
      iVar1 = (uint)bVar2 + iVar1 * 10 + -0x30;
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar2 != 0);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
LAB_002cd3fa:
  *errorCode = U_INVALID_FORMAT_ERROR;
  return -1;
}

Assistant:

static int32_t parseSetNum(const char *setNumStr, UErrorCode &errorCode) {
        if (U_FAILURE(errorCode)) { return -1; }

        if (uprv_strncmp(setNumStr, "set", 3) != 0) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return -1;
        }

        int32_t i = 3;
        int32_t setNum = 0;
        while (setNumStr[i] != 0) {
            int32_t digit = setNumStr[i] - '0';
            if (digit < 0 || 9 < digit) {
                errorCode = U_INVALID_FORMAT_ERROR;
                return -1;
            }
            setNum = 10 * setNum + digit;
            ++i;
        }

        // Rule set number must not be zero. (0 is used to indicate "not found" by hashmap.)
        // Currently ICU data conveniently starts numbering rule sets from 1.
        if (setNum == 0) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return -1;
        } else {
            return setNum;
        }
    }